

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

int waitconnect_getsock(connectdata *conn,curl_socket_t *sock,int numsocks)

{
  uint local_30;
  int local_2c;
  int rc;
  int s;
  int i;
  int numsocks_local;
  curl_socket_t *sock_local;
  connectdata *conn_local;
  
  local_2c = 0;
  local_30 = 0;
  if (numsocks == 0) {
    conn_local._4_4_ = 0;
  }
  else if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
          (((conn->bits).proxy_ssl_connected[0] & 1U) == 0)) {
    conn_local._4_4_ = Curl_ssl_getsock(conn,sock,numsocks);
  }
  else {
    for (rc = 0; rc < 2; rc = rc + 1) {
      if (conn->tempsock[rc] != -1) {
        sock[local_2c] = conn->tempsock[rc];
        local_30 = 1 << ((char)local_2c + 0x10U & 0x1f) | local_30;
        local_2c = local_2c + 1;
      }
    }
    conn_local._4_4_ = local_30;
  }
  return conn_local._4_4_;
}

Assistant:

static int waitconnect_getsock(struct connectdata *conn,
                               curl_socket_t *sock,
                               int numsocks)
{
  int i;
  int s = 0;
  int rc = 0;

  if(!numsocks)
    return GETSOCK_BLANK;

#ifdef USE_SSL
  if(CONNECT_FIRSTSOCKET_PROXY_SSL())
    return Curl_ssl_getsock(conn, sock, numsocks);
#endif

  for(i = 0; i<2; i++) {
    if(conn->tempsock[i] != CURL_SOCKET_BAD) {
      sock[s] = conn->tempsock[i];
      rc |= GETSOCK_WRITESOCK(s++);
    }
  }

  return rc;
}